

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_meth_phys(parser *p)

{
  uint uVar1;
  void *pvVar2;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 != (void *)0x0) {
    uVar1 = parser_getuint(p,"phys");
    *(bool *)((long)pvVar2 + 0xb) = uVar1 != 0;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("meth",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x94,"enum parser_error parse_meth_phys(struct parser *)");
}

Assistant:

static enum parser_error parse_meth_phys(struct parser *p) {
	struct blow_method *meth = parser_priv(p);
	int val;
	assert(meth);

	val = parser_getuint(p, "phys");
	meth->phys = val ? true : false;
	return PARSE_ERROR_NONE;
}